

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::anon_unknown_0::IsSurrogate
          (anon_unknown_0 *this,char32_t c,string_view src,Nullable<std::string_*> error)

{
  string_view pc;
  AlphaNum *b;
  undefined4 in_register_00000034;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  AlphaNum *local_30;
  Nullable<std::string_*> error_local;
  size_t sStack_20;
  char32_t c_local;
  string_view src_local;
  
  sStack_20 = CONCAT44(in_register_00000034,c);
  b = (AlphaNum *)src._M_str;
  src_local._M_len = src._M_len;
  error_local._4_4_ = (uint)this;
  if ((error_local._4_4_ < 0xd800) || (0xdfff < error_local._4_4_)) {
    src_local._M_str._7_1_ = false;
  }
  else {
    if (b != (AlphaNum *)0x0) {
      local_30 = b;
      AlphaNum::AlphaNum(&local_80,"invalid surrogate character (0xD800-DFFF): \\");
      pc._M_str = (char *)src_local._M_len;
      pc._M_len = sStack_20;
      AlphaNum::AlphaNum(&local_b0,pc);
      StrCat_abi_cxx11_(&local_50,(lts_20250127 *)&local_80,&local_b0,b);
      std::__cxx11::string::operator=((string *)local_30,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    src_local._M_str._7_1_ = true;
  }
  return src_local._M_str._7_1_;
}

Assistant:

inline bool IsSurrogate(char32_t c, absl::string_view src,
                        absl::Nullable<std::string*> error) {
  if (c >= 0xD800 && c <= 0xDFFF) {
    if (error) {
      *error = absl::StrCat("invalid surrogate character (0xD800-DFFF): \\",
                            src);
    }
    return true;
  }
  return false;
}